

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int geopolyFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
                 sqlite3_value **argv)

{
  float fVar1;
  Rtree *pRtree;
  RtreeNode *pRVar2;
  int iVar3;
  i64 iRowid;
  RtreeSearchPoint *pRVar4;
  sqlite3_vtab *psVar5;
  long in_FS_OFFSET;
  i64 iNode;
  int iCell;
  RtreeNode *pRoot;
  RtreeNode *pLeaf;
  sqlite3_int64 local_60;
  int local_58;
  int local_54;
  sqlite3_vtab_cursor local_50;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRtree = (Rtree *)pVtabCursor->pVtab;
  local_50.pVtab = (sqlite3_vtab *)0x0;
  local_58 = 0;
  pRtree->nBusy = pRtree->nBusy + 1;
  resetCursor((RtreeCursor *)pVtabCursor);
  *(int *)((long)&pVtabCursor[1].pVtab + 4) = idxNum;
  if (idxNum == 1) {
    local_48 = (RtreeNode *)&DAT_aaaaaaaaaaaaaaaa;
    iRowid = sqlite3VdbeIntValue(*argv);
    local_60 = 0;
    local_54 = findLeafNode(pRtree,iRowid,(RtreeNode **)&local_48,&local_60);
    pRVar2 = local_48;
    if (local_48 == (RtreeNode *)0x0 || local_54 != 0) {
      *(undefined1 *)&pVtabCursor[1].pVtab = 1;
    }
    else {
      pRVar4 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,'\0');
      pVtabCursor[0xb].pVtab = (sqlite3_vtab *)pRVar2;
      pRVar4->id = local_60;
      pRVar4->eWithin = '\x01';
      local_54 = nodeRowidIndex(pRtree,(RtreeNode *)pRVar2->zData,iRowid,&local_58);
      pRVar4->iCell = (u8)local_58;
    }
    goto LAB_001fcac4;
  }
  local_54 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,(RtreeNode **)&local_50);
  if (idxNum < 4 && local_54 == 0) {
    local_48 = (RtreeNode *)0xffffffffffffffff;
    fStack_40 = -NAN;
    fStack_3c = -NAN;
    geopolyBBox((sqlite3_context *)0x0,*argv,(RtreeCoord *)&local_48,&local_54);
    if (local_54 != 0) goto LAB_001fcac4;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      psVar5 = (sqlite3_vtab *)sqlite3Malloc(0x60);
      pVtabCursor[3].pVtab = psVar5;
      *(undefined4 *)&pVtabCursor[2].pVtab = 4;
      if (psVar5 != (sqlite3_vtab *)0x0) {
        psVar5[3].nRef = 0;
        *(undefined4 *)&psVar5[3].field_0xc = 0;
        psVar5[3].zErrMsg = (char *)0x0;
        *(undefined1 (*) [16])&psVar5[2].zErrMsg = (undefined1  [16])0x0;
        psVar5[2].pModule = (sqlite3_module *)0x0;
        psVar5[2].nRef = 0;
        *(undefined4 *)&psVar5[2].field_0xc = 0;
        psVar5[1].nRef = 0;
        *(undefined4 *)&psVar5[1].field_0xc = 0;
        psVar5[1].zErrMsg = (char *)0x0;
        *(undefined1 (*) [16])&psVar5->zErrMsg = (undefined1  [16])0x0;
        psVar5->pModule = (sqlite3_module *)0x0;
        psVar5->nRef = 0;
        *(undefined4 *)&psVar5->field_0xc = 0;
        memset(pVtabCursor + 0x10,0,(long)pRtree->iDepth * 4 + 4);
        if (idxNum == 2) {
          psVar5->pModule = (sqlite3_module *)0x4200000000;
          *(double *)&psVar5->nRef = (double)local_48._4_4_;
          psVar5[1].pModule = (sqlite3_module *)0x4400000001;
          *(double *)&psVar5[1].nRef = (double)local_48._0_4_;
          psVar5[2].pModule = (sqlite3_module *)0x4200000002;
          *(double *)&psVar5[2].nRef = (double)fStack_3c;
          psVar5[3].pModule = (sqlite3_module *)0x4400000003;
          fVar1 = fStack_40;
        }
        else {
          psVar5->pModule = (sqlite3_module *)0x4400000000;
          *(double *)&psVar5->nRef = (double)local_48._0_4_;
          psVar5[1].pModule = (sqlite3_module *)0x4200000001;
          *(double *)&psVar5[1].nRef = (double)local_48._4_4_;
          psVar5[2].pModule = (sqlite3_module *)0x4400000002;
          *(double *)&psVar5[2].nRef = (double)fStack_40;
          psVar5[3].pModule = (sqlite3_module *)0x4200000003;
          fVar1 = fStack_3c;
        }
        *(double *)&psVar5[3].nRef = (double)fVar1;
        goto joined_r0x001fca77;
      }
    }
    else {
      pVtabCursor[3].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pVtabCursor[2].pVtab = 4;
    }
    local_54 = 7;
  }
  else {
joined_r0x001fca77:
    if (local_54 == 0) {
      pRVar4 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,(char)pRtree->iDepth + '\x01');
      if (pRVar4 == (RtreeSearchPoint *)0x0) {
        local_54 = 7;
      }
      else {
        pRVar4->id = 1;
        pRVar4->eWithin = '\x01';
        pRVar4->iCell = '\0';
        pVtabCursor[0xb].pVtab = local_50.pVtab;
        local_50.pVtab = (sqlite3_vtab *)0x0;
        local_54 = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
      }
    }
  }
LAB_001fcac4:
  nodeRelease(pRtree,(RtreeNode *)local_50.pVtab);
  rtreeRelease(pRtree);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

static int geopolyFilter(
  sqlite3_vtab_cursor *pVtabCursor,     /* The cursor to initialize */
  int idxNum,                           /* Query plan */
  const char *idxStr,                   /* Not Used */
  int argc, sqlite3_value **argv        /* Parameters to the query plan */
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int rc = SQLITE_OK;
  int iCell = 0;
  (void)idxStr;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  resetCursor(pCsr);

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array
    ** with the configured constraints.
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && idxNum<=3 ){
      RtreeCoord bbox[4];
      RtreeConstraint *p;
      assert( argc==1 );
      assert( argv[0]!=0 );
      geopolyBBox(0, argv[0], bbox, &rc);
      if( rc ){
        goto geopoly_filter_end;
      }
      pCsr->aConstraint = p = sqlite3_malloc(sizeof(RtreeConstraint)*4);
      pCsr->nConstraint = 4;
      if( p==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*4);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        if( idxNum==2 ){
          /* Overlap query */
          p->op = 'B';
          p->iCoord = 0;
          p->u.rValue = bbox[1].f;
          p++;
          p->op = 'D';
          p->iCoord = 1;
          p->u.rValue = bbox[0].f;
          p++;
          p->op = 'B';
          p->iCoord = 2;
          p->u.rValue = bbox[3].f;
          p++;
          p->op = 'D';
          p->iCoord = 3;
          p->u.rValue = bbox[2].f;
        }else{
          /* Within query */
          p->op = 'D';
          p->iCoord = 0;
          p->u.rValue = bbox[0].f;
          p++;
          p->op = 'B';
          p->iCoord = 1;
          p->u.rValue = bbox[1].f;
          p++;
          p->op = 'D';
          p->iCoord = 2;
          p->u.rValue = bbox[2].f;
          p++;
          p->op = 'B';
          p->iCoord = 3;
          p->u.rValue = bbox[3].f;
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
        goto geopoly_filter_end;
      }
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

geopoly_filter_end:
  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}